

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void __thiscall MCTS::Node<NimState>::Node(Node<NimState> *this,NimState *state)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  NimState *in_stack_00000028;
  
  *in_RDI = 0xffffffff;
  *(undefined8 *)(in_RDI + 2) = 0;
  in_RDI[4] = *in_RSI;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0;
  NimState::get_moves(in_stack_00000028);
  std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::vector
            ((vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_> *)0x12b259);
  *(undefined8 *)(in_RDI + 0x16) = 0;
  return;
}

Assistant:

Node<State>::Node(const State& state) :
	move(State::no_move),
	parent(nullptr),
	player_to_move(state.player_to_move),
	wins(0),
	visits(0),
	moves(state.get_moves()),
	UCT_score(0)
{ }